

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_file_nlinks(char *file,wchar_t line,char *pathname,wchar_t nlinks)

{
  bool bVar1;
  int iVar2;
  stat st;
  stat sStack_b8;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar2 = lstat(pathname,&sStack_b8);
  bVar1 = (wchar_t)sStack_b8.st_nlink == nlinks;
  if (!bVar1 || iVar2 != 0) {
    failure_start(file,line,"File %s has %jd links, expected %d",pathname,sStack_b8.st_nlink,
                  (ulong)(uint)nlinks);
    failure_finish((void *)0x0);
  }
  return (uint)(bVar1 && iVar2 == 0);
}

Assistant:

int
assertion_file_nlinks(const char *file, int line,
    const char *pathname, int nlinks)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi;
	int r;

	assertion_count(file, line);
	r = my_GetFileInformationByName(pathname, &bhfi);
	if (r != 0 && bhfi.nNumberOfLinks == (DWORD)nlinks)
		return (1);
	failure_start(file, line, "File %s has %jd links, expected %d",
	    pathname, (intmax_t)bhfi.nNumberOfLinks, nlinks);
	failure_finish(NULL);
	return (0);
#else
	struct stat st;
	int r;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r == 0 && (int)st.st_nlink == nlinks)
		return (1);
	failure_start(file, line, "File %s has %jd links, expected %d",
	    pathname, (intmax_t)st.st_nlink, nlinks);
	failure_finish(NULL);
	return (0);
#endif
}